

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O1

Array2D<Color> * __thiscall
TilingWFC<Color>::id_to_tiling
          (Array2D<Color> *__return_storage_ptr__,TilingWFC<Color> *this,Array2D<unsigned_int> *ids)

{
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  pointer ppVar4;
  long lVar5;
  long lVar6;
  pointer pCVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint x;
  int iVar14;
  uint local_40;
  int local_3c;
  
  iVar2 = **(int **)&(((this->tiles).super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data).
                     super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>;
  Array2D<Color>::Array2D(__return_storage_ptr__,ids->height * iVar2,ids->width * iVar2);
  if (ids->height != 0) {
    local_3c = 0;
    local_40 = 0;
    do {
      uVar8 = ids->width;
      if (uVar8 != 0) {
        iVar9 = 0;
        uVar10 = 0;
        do {
          if (iVar2 != 0) {
            ppVar4 = (this->id_to_oriented_tile).
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = (ids->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar8 * local_40 + uVar10];
            uVar3 = ppVar4[uVar8].first;
            iVar12 = 0;
            lVar11 = (ulong)ppVar4[uVar8].second * 0x20;
            iVar13 = local_3c;
            do {
              iVar14 = 0;
              do {
                lVar5 = *(long *)&(this->tiles).
                                  super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar3].data.
                                  super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>
                ;
                lVar6 = *(long *)(lVar5 + 8 + lVar11);
                lVar5 = (ulong)(uint)(*(int *)(lVar5 + 4 + lVar11) * iVar12 + iVar14) * 3;
                uVar8 = __return_storage_ptr__->width * iVar13 + iVar9 + iVar14;
                pCVar7 = (__return_storage_ptr__->data).
                         super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar7[uVar8].b = *(uchar *)(lVar6 + 2 + lVar5);
                uVar1 = *(undefined2 *)(lVar6 + lVar5);
                pCVar7 = pCVar7 + uVar8;
                pCVar7->r = (char)uVar1;
                pCVar7->g = (char)((ushort)uVar1 >> 8);
                iVar14 = iVar14 + 1;
              } while (iVar2 != iVar14);
              iVar12 = iVar12 + 1;
              iVar13 = iVar13 + 1;
            } while (iVar12 != iVar2);
          }
          uVar10 = uVar10 + 1;
          uVar8 = ids->width;
          iVar9 = iVar9 + iVar2;
        } while (uVar10 < uVar8);
      }
      local_40 = local_40 + 1;
      local_3c = local_3c + iVar2;
    } while (local_40 < ids->height);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> id_to_tiling(Array2D<unsigned> ids) {
		unsigned size = tiles[0].data[0].height;
		Array2D<T> tiling(size * ids.height, size * ids.width);
		for (unsigned i = 0; i < ids.height; i++) {
			for (unsigned j = 0; j < ids.width; j++) {
				std::pair<unsigned, unsigned> oriented_tile =
					id_to_oriented_tile[ids.get(i, j)];
				for (unsigned y = 0; y < size; y++) {
					for (unsigned x = 0; x < size; x++) {
						tiling.get(i * size + y, j * size + x) =
							tiles[oriented_tile.first].data[oriented_tile.second].get(y, x);
					}
				}
			}
		}
		return tiling;
	}